

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::SharedDtor(CodeGeneratorResponse_File *this)

{
  string *psVar1;
  pointer pcVar2;
  
  psVar1 = this->name_;
  if (psVar1 != (string *)internal::kEmptyString_abi_cxx11_) {
    if (psVar1 != (string *)0x0) {
      pcVar2 = (psVar1->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &psVar1->field_2) {
        operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
      }
    }
    operator_delete(psVar1,0x20);
  }
  psVar1 = this->insertion_point_;
  if (psVar1 != (string *)internal::kEmptyString_abi_cxx11_) {
    if (psVar1 != (string *)0x0) {
      pcVar2 = (psVar1->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &psVar1->field_2) {
        operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
      }
    }
    operator_delete(psVar1,0x20);
  }
  psVar1 = this->content_;
  if (psVar1 != (string *)internal::kEmptyString_abi_cxx11_) {
    if (psVar1 != (string *)0x0) {
      pcVar2 = (psVar1->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar2 != &psVar1->field_2) {
        operator_delete(pcVar2,(psVar1->field_2)._M_allocated_capacity + 1);
      }
    }
    operator_delete(psVar1,0x20);
    return;
  }
  return;
}

Assistant:

void CodeGeneratorResponse_File::SharedDtor() {
  if (name_ != &::google::protobuf::internal::kEmptyString) {
    delete name_;
  }
  if (insertion_point_ != &::google::protobuf::internal::kEmptyString) {
    delete insertion_point_;
  }
  if (content_ != &::google::protobuf::internal::kEmptyString) {
    delete content_;
  }
  if (this != default_instance_) {
  }
}